

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_segment.cpp
# Opt level: O1

void __thiscall
duckdb::ColumnSegment::ColumnSegment(ColumnSegment *this,ColumnSegment *other,idx_t start)

{
  __int_type _Var1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  idx_t iVar4;
  _Head_base<0UL,_duckdb::CompressedSegmentState_*,_false> _Var5;
  
  _Var1 = (other->super_SegmentBase<duckdb::ColumnSegment>).count.super___atomic_base<unsigned_long>
          ._M_i;
  (this->super_SegmentBase<duckdb::ColumnSegment>).start = start;
  (this->super_SegmentBase<duckdb::ColumnSegment>).count.super___atomic_base<unsigned_long>._M_i =
       _Var1;
  (this->super_SegmentBase<duckdb::ColumnSegment>).next._M_b._M_p = (__pointer_type)0x0;
  this->db = other->db;
  LogicalType::LogicalType(&this->type,&other->type);
  this->type_size = other->type_size;
  this->segment_type = other->segment_type;
  BaseStatistics::BaseStatistics(&(this->stats).statistics,&(other->stats).statistics);
  (this->block).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (other->block).internal.
           super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (other->block).internal.
           super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (other->block).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->block).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar2;
  (this->block).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  (other->block).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->function)._M_data = (other->function)._M_data;
  iVar4 = other->offset;
  this->block_id = other->block_id;
  this->offset = iVar4;
  _Var5._M_head_impl =
       (other->segment_state).
       super_unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::CompressedSegmentState_*,_std::default_delete<duckdb::CompressedSegmentState>_>
       .super__Head_base<0UL,_duckdb::CompressedSegmentState_*,_false>._M_head_impl;
  this->segment_size = other->segment_size;
  (this->segment_state).
  super_unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::CompressedSegmentState_*,_std::default_delete<duckdb::CompressedSegmentState>_>
  .super__Head_base<0UL,_duckdb::CompressedSegmentState_*,_false>._M_head_impl = _Var5._M_head_impl;
  (other->segment_state).
  super_unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::CompressedSegmentState_*,_std::default_delete<duckdb::CompressedSegmentState>_>
  .super__Head_base<0UL,_duckdb::CompressedSegmentState_*,_false>._M_head_impl =
       (CompressedSegmentState *)0x0;
  return;
}

Assistant:

ColumnSegment::ColumnSegment(ColumnSegment &other, const idx_t start)

    : SegmentBase<ColumnSegment>(start, other.count.load()), db(other.db), type(std::move(other.type)),
      type_size(other.type_size), segment_type(other.segment_type), stats(std::move(other.stats)),
      block(std::move(other.block)), function(other.function), block_id(other.block_id), offset(other.offset),
      segment_size(other.segment_size), segment_state(std::move(other.segment_state)) {

	// For constant segments (CompressionType::COMPRESSION_CONSTANT) the block is a nullptr.
	D_ASSERT(!block || segment_size <= GetBlockManager().GetBlockSize());
}